

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.hpp
# Opt level: O2

Inst * __thiscall mir::inst::CallInst::deep_copy(CallInst *this)

{
  CallInst *this_00;
  VarId local_58;
  _Vector_base<mir::inst::Value,_std::allocator<mir::inst::Value>_> local_48;
  string local_30;
  
  this_00 = (CallInst *)operator_new(0x50);
  local_58.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001d90d0;
  local_58.id = (this->super_Inst).dest.id;
  std::__cxx11::string::string((string *)&local_30,(string *)&this->func);
  std::vector<mir::inst::Value,_std::allocator<mir::inst::Value>_>::vector
            ((vector<mir::inst::Value,_std::allocator<mir::inst::Value>_> *)&local_48,&this->params)
  ;
  CallInst(this_00,&local_58,&local_30,
           (vector<mir::inst::Value,_std::allocator<mir::inst::Value>_> *)&local_48);
  std::_Vector_base<mir::inst::Value,_std::allocator<mir::inst::Value>_>::~_Vector_base(&local_48);
  std::__cxx11::string::~string((string *)&local_30);
  return &this_00->super_Inst;
}

Assistant:

Inst* deep_copy() { return new CallInst(dest, func, params); }